

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_com.c
# Opt level: O2

void hal_vp9d_update_counts(void *buf,void *dxva)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  ushort uVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int *piVar16;
  size_t __n;
  int *piVar17;
  long lStack_50;
  
  uVar5 = *(ushort *)((long)dxva + 2) & 0x81;
  __n = 0x188;
  if (uVar5 == 1) {
    __n = 0x6a8;
  }
  memcpy((void *)((long)dxva + 0x8c8),buf,__n);
  if (uVar5 == 1) {
    lStack_50 = 2;
  }
  else {
    memset((void *)((long)dxva + 0xf70),0,0x2d00);
    lStack_50 = 1;
  }
  piVar16 = (int *)((long)buf + __n);
  lVar9 = (long)dxva + 0x2a74;
  piVar4 = (int *)((long)dxva + 0xf78);
  for (lVar3 = 0; lVar3 != lStack_50; lVar3 = lVar3 + 1) {
    piVar7 = piVar4;
    lVar8 = lVar9;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      piVar11 = piVar7;
      lVar12 = lVar8;
      for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
        lVar14 = lVar12;
        piVar17 = piVar11;
        for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
          piVar6 = piVar17;
          for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
            iVar1 = piVar16[1];
            *(int *)(lVar14 + -4 + lVar2 * 8) = iVar1;
            *(int *)(lVar14 + lVar2 * 8) = *piVar16 - iVar1;
            piVar6[-2] = piVar16[2];
            piVar6[-1] = piVar16[3];
            *piVar6 = piVar16[4];
            piVar16 = piVar16 + 5;
            piVar6 = piVar6 + 3;
          }
          lVar14 = lVar14 + 0x30;
          piVar17 = piVar17 + 0x12;
        }
        lVar12 = lVar12 + 0x240;
        piVar11 = piVar11 + 0xd8;
      }
      lVar8 = lVar8 + 0x480;
      piVar7 = piVar7 + 0x1b0;
    }
    lVar9 = lVar9 + 0x120;
    piVar4 = piVar4 + 0x6c;
  }
  return;
}

Assistant:

void hal_vp9d_update_counts(void *buf, void *dxva)
{
    DXVA_PicParams_VP9 *s = (DXVA_PicParams_VP9*)dxva;
    RK_S32 i, j, m, n, k;
    RK_U32 *eob_coef;
    RK_S32 ref_type;
#ifdef dump
    RK_U32 count_length;
#endif
    RK_U32 com_len = 0;

#ifdef dump
    if (!(s->frame_type == 0 || s->intra_only)) //inter
        count_length = (213 * 64 + 576 * 5 * 32) / 8;
    else //intra
        count_length = (49 * 64 + 288 * 5 * 32) / 8;

    fwrite(buf, 1, count_length, vp9_fp1);
    fflush(vp9_fp1);
#endif
    if ((s->frame_type == 0 || s->intra_only)) {
        com_len = sizeof(s->counts.partition) + sizeof(s->counts.skip) + sizeof(s->counts.intra)
                  + sizeof(s->counts.tx32p) + sizeof(s->counts.tx16p) + sizeof(s->counts.tx8p);
    } else {
        com_len = sizeof(s->counts) - sizeof(s->counts.coef) - sizeof(s->counts.eob);
    }
    eob_coef = (RK_U32 *)(buf + com_len);
    memcpy(&s->counts, buf, com_len);
    ref_type = (!(s->frame_type == 0 || s->intra_only)) ? 2 : 1;
    if (ref_type == 1) {
        memset(s->counts.eob, 0, sizeof(s->counts.eob));
        memset(s->counts.coef, 0, sizeof(s->counts.coef));
    }
    for (i = 0; i < ref_type; i++) {
        for (j = 0; j < 4; j++) {
            for (m = 0; m < 2; m++) {
                for (n = 0; n < 6; n++) {
                    for (k = 0; k < 6; k++) {
                        s->counts.eob[j][m][i][n][k][0] = eob_coef[1];
                        s->counts.eob[j][m][i][n][k][1] = eob_coef[0] - eob_coef[1]; //ffmpeg need do  branch_ct[UNCONSTRAINED_NODES][2] =  { neob, eob_counts[i][j][k][l] - neob },
                        s->counts.coef[j][m][i][n][k][0] = eob_coef[2];
                        s->counts.coef[j][m][i][n][k][1] = eob_coef[3];
                        s->counts.coef[j][m][i][n][k][2] = eob_coef[4];
                        eob_coef += 5;
                    }
                }
            }
        }
    }
}